

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<11>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  long lVar1;
  RepeatedPtrFieldBase *array;
  long lVar2;
  uint32 local_2c;
  
  if (0 < *(int *)((long)field + 8)) {
    lVar2 = 0;
    do {
      local_2c = md->tag;
      PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
      lVar1 = *(long *)((long)field + 0x10) + 8;
      if (*(long *)((long)field + 0x10) == 0) {
        lVar1 = 0;
      }
      SerializeMessageTo<google::protobuf::io::CodedOutputStream>
                (*(MessageLite **)(lVar1 + lVar2 * 8),md->ptr,output);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)((long)field + 8));
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeMessageTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          md.ptr, output);
    }
  }